

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_strip.c
# Opt level: O0

uint64_t TIFFRawStripSize64(TIFF *tif,uint32_t strip)

{
  uint64_t local_20;
  uint64_t bytecount;
  uint32_t strip_local;
  TIFF *tif_local;
  
  local_20 = TIFFGetStrileByteCount(tif,strip);
  if (local_20 == 0) {
    TIFFErrorExtR(tif,"TIFFRawStripSize64","%lu: Invalid strip byte count, strip %lu",0,(ulong)strip
                 );
    local_20 = 0xffffffffffffffff;
  }
  return local_20;
}

Assistant:

uint64_t TIFFRawStripSize64(TIFF *tif, uint32_t strip)
{
    static const char module[] = "TIFFRawStripSize64";
    uint64_t bytecount = TIFFGetStrileByteCount(tif, strip);

    if (bytecount == 0)
    {
        TIFFErrorExtR(tif, module,
                      "%" PRIu64 ": Invalid strip byte count, strip %lu",
                      (uint64_t)bytecount, (unsigned long)strip);
        bytecount = (uint64_t)-1;
    }

    return bytecount;
}